

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

void __thiscall
Employee::Employee(Employee *this,string *name,string *id,Address *address,int h,int ph,int wtd,
                  int wd)

{
  int iVar1;
  string local_50 [32];
  int local_30;
  int local_2c;
  int ph_local;
  int h_local;
  Address *address_local;
  string *id_local;
  string *name_local;
  Employee *this_local;
  
  local_30 = ph;
  local_2c = h;
  _ph_local = address;
  address_local = (Address *)id;
  id_local = name;
  name_local = (string *)this;
  Person::Person(&this->super_Person,name,id,address);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_0010ad58;
  this->hourWork = local_2c;
  this->salaryPerHour = local_30;
  this->workToDo = wtd;
  this->workDone = wd;
  std::__cxx11::string::string(local_50,(string *)address_local);
  iVar1 = (**(this->super_Person)._vptr_Person)(this,local_50);
  std::__cxx11::string::~string(local_50);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    return;
  }
  std::operator<<((ostream *)&std::cout,"Invalid input");
  exit(1);
}

Assistant:

Employee::Employee(const string &name, const string &id, const Address &address, int h, int ph, int wtd, int wd) :
        Person(name, id, address) {
    this->hourWork = h;
    this->salaryPerHour = ph;
    this->workToDo = wtd;
    this->workDone = wd;
    if (!validate(id)) { // if the id was invalid exit the program
        cout << "Invalid input";
        exit(1);
    }

}